

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::AnyTest_DifferentTypes_Test::TestBody
          (AnyTest_DifferentTypes_Test *this)

{
  bool bVar1;
  Any *pAVar2;
  PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *matcher;
  char *message;
  char *in_R9;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_340;
  AssertHelper local_338;
  AssertionResult gtest_ar_;
  string local_320;
  ForeignMessage value2;
  PolymorphicMatcher<testing::internal::MatchesRegexMatcher> local_2e0;
  string difference_string;
  TestAny m2;
  TestAny m1;
  TestField value1;
  MessageDifferencer message_differencer;
  
  proto2_unittest::TestField::TestField(&value1);
  value1.field_0._impl_.a_ = 0x14;
  value1.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       value1.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 4;
  proto2_unittest::ForeignMessage::ForeignMessage(&value2);
  value2.field_0._impl_.c_ = 0x1e;
  value2.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       value2.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 1;
  proto2_unittest::TestAny::TestAny(&m1);
  proto2_unittest::TestAny::TestAny(&m2);
  pAVar2 = proto2_unittest::TestAny::mutable_any_value(&m1);
  Any::PackFrom(pAVar2,&value1.super_Message);
  pAVar2 = proto2_unittest::TestAny::mutable_any_value(&m2);
  Any::PackFrom(pAVar2,&value2.super_Message);
  util::MessageDifferencer::MessageDifferencer(&message_differencer);
  difference_string._M_dataplus._M_p = (pointer)&difference_string.field_2;
  difference_string._M_string_length = 0;
  difference_string.field_2._M_local_buf[0] = '\0';
  util::MessageDifferencer::ReportDifferencesToString(&message_differencer,&difference_string);
  bVar1 = util::MessageDifferencer::Compare
                    (&message_differencer,&m1.super_Message,&m2.super_Message);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_340);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_320,(internal *)&gtest_ar_,
               (AssertionResult *)"message_differencer.Compare(m1, m2)","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x10c6,local_320._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_338,(Message *)&local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_338);
    std::__cxx11::string::~string((string *)&local_320);
    if (local_340._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_340._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  testing::ContainsRegex<char[81]>
            (&local_2e0,
             (StringLike<char[81]> *)
             "type_url: \".+/proto2_unittest.TestField\\\" -> \".+/proto2_unittest.ForeignMessage\""
            );
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::MatchesRegexMatcher>>
            ((PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::MatchesRegexMatcher>_>
              *)&local_320,(internal *)&local_2e0,matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::MatchesRegexMatcher>>
  ::operator()(&gtest_ar_,(char *)&local_320,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               "difference_string");
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_320._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2e0.impl_.regex_.
              super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_320);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = anon_var_dwarf_651463 + 5;
    }
    else {
      message = *(char **)gtest_ar_.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_340,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x10cb,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_340,(Message *)&local_320);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_340);
    if ((long *)local_320._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_320._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  std::__cxx11::string::~string((string *)&difference_string);
  util::MessageDifferencer::~MessageDifferencer(&message_differencer);
  proto2_unittest::TestAny::~TestAny(&m2);
  proto2_unittest::TestAny::~TestAny(&m1);
  proto2_unittest::ForeignMessage::~ForeignMessage(&value2);
  proto2_unittest::TestField::~TestField(&value1);
  return;
}

Assistant:

TEST(AnyTest, DifferentTypes) {
  proto2_unittest::TestField value1;
  value1.set_a(20);
  proto2_unittest::ForeignMessage value2;
  value2.set_c(30);

  proto2_unittest::TestAny m1, m2;
  m1.mutable_any_value()->PackFrom(value1);
  m2.mutable_any_value()->PackFrom(value2);
  util::MessageDifferencer message_differencer;
  std::string difference_string;
  message_differencer.ReportDifferencesToString(&difference_string);
  EXPECT_FALSE(message_differencer.Compare(m1, m2));
  // Any should be treated as a regular proto when the payload types differ.
  EXPECT_THAT(
      difference_string,
      testing::ContainsRegex(
          R"(type_url: ".+/proto2_unittest.TestField\" -> ".+/proto2_unittest.ForeignMessage")"));
}